

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_filename.c
# Opt level: O3

void test_read_format_gtar_filename_KOI8R_UTF8(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  pcVar3 = setlocale(6,"en_US.UTF-8");
  if (pcVar3 != (char *)0x0) {
    extract_reference_file("test_read_format_gtar_filename_koi8r.tar.Z");
    a = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ÿ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'Ā',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ā',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    iVar1 = archive_read_set_options((archive *)a,"hdrcharset=KOI8-R");
    if (iVar1 == 0) {
      wVar2 = archive_read_open_filename(a,"test_read_format_gtar_filename_koi8r.tar.Z",0x2800);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ĉ',0,"ARCHIVE_OK",(long)wVar2,
                          "archive_read_open_filename(a, refname, 10240)",a);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ċ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'č',anon_var_dwarf_6f2c0,
                 "\"\\xd0\\xbf\\xd1\\x80\\xd0\\xb8\\xd0\\xb2\\xd0\\xb5\\xd1\\x82\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ď',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'đ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      pcVar3 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ē',anon_var_dwarf_6f29e,
                 "\"\\xd0\\x9f\\xd0\\xa0\\xd0\\x98\\xd0\\x92\\xd0\\x95\\xd0\\xa2\"",pcVar3,
                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
      lVar4 = archive_entry_size(local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ĕ',6,"6",lVar4,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ę',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      iVar1 = archive_filter_code((archive *)a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ě',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)"
                          ,a);
      iVar1 = archive_format((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'Ĝ',0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",(long)iVar1,"archive_format(a)"
                          ,a);
      iVar1 = archive_read_close((archive *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                          ,L'ğ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                     ,L'ă');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
    }
    iVar1 = archive_read_free((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                        ,L'ġ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_filename.c"
                 ,L'ú');
  test_skipping("en_US.UTF-8 locale not available on this system.");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_filename_KOI8R_UTF8)
{
	const char *refname = "test_read_format_gtar_filename_koi8r.tar.Z";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read KOI8-R filename in en_US.UTF-8 with "hdrcharset=KOI8-R" option.
	 */
	if (NULL == setlocale(LC_ALL, "en_US.UTF-8")) {
		skipping("en_US.UTF-8 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=KOI8-R")) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to UTF-8.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xd0\xbf\xd1\x80\xd0\xb8\xd0\xb2\xd0\xb5\xd1\x82",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("\xd0\x9f\xd0\xa0\xd0\x98\xd0\x92\xd0\x95\xd0\xa2",
	    archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_GNUTAR, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}